

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void AddWindowToRenderList(ImVector<ImDrawList_*> *out_render_list,ImGuiWindow *window)

{
  ImGuiWindow *window_00;
  value_type *ppIVar1;
  ImGuiWindow *child;
  int i;
  ImGuiWindow *window_local;
  ImVector<ImDrawList_*> *out_render_list_local;
  
  AddDrawListToRenderList(out_render_list,window->DrawList);
  for (child._4_4_ = 0; child._4_4_ < (window->DC).ChildWindows.Size; child._4_4_ = child._4_4_ + 1)
  {
    ppIVar1 = ImVector<ImGuiWindow_*>::operator[](&(window->DC).ChildWindows,child._4_4_);
    window_00 = *ppIVar1;
    if (((window_00->Active & 1U) != 0) &&
       (((window_00->Flags & 0x2000000U) == 0 || (window_00->HiddenFrames < 1)))) {
      AddWindowToRenderList(out_render_list,window_00);
    }
  }
  return;
}

Assistant:

static void AddWindowToRenderList(ImVector<ImDrawList*>& out_render_list, ImGuiWindow* window)
{
    AddDrawListToRenderList(out_render_list, window->DrawList);
    for (int i = 0; i < window->DC.ChildWindows.Size; i++)
    {
        ImGuiWindow* child = window->DC.ChildWindows[i];
        if (!child->Active) // clipped children may have been marked not active
            continue;
        if ((child->Flags & ImGuiWindowFlags_Popup) && child->HiddenFrames > 0)
            continue;
        AddWindowToRenderList(out_render_list, child);
    }
}